

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O0

void __thiscall QListWidgetPrivate::clearConnections(QListWidgetPrivate *this)

{
  iterator pvVar1;
  iterator pvVar2;
  Connection *connection_1;
  iterator __end1_1;
  iterator __begin1_1;
  array<QMetaObject::Connection,_2UL> *__range1_1;
  Connection *connection;
  iterator __end1;
  iterator __begin1;
  array<QMetaObject::Connection,_8UL> *__range1;
  Connection *local_38;
  Connection *local_18;
  
  local_18 = std::array<QMetaObject::Connection,_8UL>::begin
                       ((array<QMetaObject::Connection,_8UL> *)0x89d15b);
  pvVar1 = std::array<QMetaObject::Connection,_8UL>::end
                     ((array<QMetaObject::Connection,_8UL> *)0x89d16a);
  for (; local_18 != pvVar1; local_18 = local_18 + 1) {
    QObject::disconnect(local_18);
  }
  local_38 = std::array<QMetaObject::Connection,_2UL>::begin
                       ((array<QMetaObject::Connection,_2UL> *)0x89d1d7);
  pvVar2 = std::array<QMetaObject::Connection,_2UL>::end
                     ((array<QMetaObject::Connection,_2UL> *)0x89d1e6);
  for (; local_38 != pvVar2; local_38 = local_38 + 1) {
    QObject::disconnect(local_38);
  }
  return;
}

Assistant:

void QListWidgetPrivate::clearConnections()
{
    for (const QMetaObject::Connection &connection : connections)
        QObject::disconnect(connection);
    for (const QMetaObject::Connection &connection : selectionModelConnections)
        QObject::disconnect(connection);
}